

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O1

int main(void)

{
  size_type __n;
  void *__s;
  ostream *poVar1;
  int i;
  uint32_t uVar2;
  vector<char,_std::allocator<char>_> code;
  PowerCore core;
  ifstream in;
  vector<char,_std::allocator<char>_> local_468;
  PowerCore local_450;
  char local_238 [520];
  
  std::ifstream::ifstream(local_238,"testfun.bin",_S_in);
  std::istream::seekg((long)local_238,_S_beg);
  __n = std::istream::tellg();
  std::istream::seekg(local_238,0,0);
  std::vector<char,_std::allocator<char>_>::vector(&local_468,__n,(allocator_type *)&local_450);
  std::istream::read(local_238,
                     (long)local_468.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start);
  __s = operator_new(0x100000);
  uVar2 = 0;
  memset(__s,0,0x100000);
  memset(&local_450,0,0x193);
  local_450.memoryBases[2] = (void *)0x0;
  local_450.memoryBases[3] = (void *)0x0;
  local_450.blocks._M_h._M_buckets = &local_450.blocks._M_h._M_single_bucket;
  local_450.syscall = (_func_uint32_t_PowerCore_ptr *)0x0;
  local_450.handleInterrupt = (_func_void_PowerCore_ptr *)0x0;
  local_450.debugger = (_func_void_PowerCore_ptr *)0x0;
  local_450.getNextBreakpoint = (_func_uint32_t_uint32_t *)0x0;
  local_450.blocks._M_h._M_bucket_count = 1;
  local_450.blocks._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_450.blocks._M_h._M_element_count = 0;
  local_450.blocks._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_450.blocks._M_h._M_rehash_policy._M_next_resize = 0;
  local_450.blocks._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_450.memoryBases[0] =
       local_468.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_start;
  local_450.memoryBases[1] = (void *)((long)__s + -0x40000000);
  local_450.super_PowerCoreState.r[1] = 0x400ffc00;
  do {
    local_450.super_PowerCoreState.r[3] = uVar2;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"in: ",4);
    *(uint *)(std::ostream::operator<< + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::ostream::operator<< + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    local_450.super_PowerCoreState.CIA = 0;
    local_450.super_PowerCoreState.lr = 0xfffffffc;
    PowerCore::execute(&local_450);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"out: ",5);
    *(uint *)(std::ostream::operator<< + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::ostream::operator<< + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    uVar2 = uVar2 + 1;
  } while (uVar2 != 0xf);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_450.blocks._M_h);
  operator_delete(__s,0x100000);
  if (local_468.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_468.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_468.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_468.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::ifstream::~ifstream(local_238);
  return 0;
}

Assistant:

int main()
{
    std::ifstream in("testfun.bin");
    in.seekg(0, std::ios::end);
    size_t sz = in.tellg();
    in.seekg(0);

    std::vector<char> code(sz);
    in.read(code.data(),sz);

    std::vector<char> stack(1024 * 1024);

    PowerCore core;

    core.memoryBases[0] = code.data();
    core.memoryBases[1] = stack.data() - 0x40000000;
    core.r[1] = 0x40000000 + 1024 * 1024 - 1024;

    for(int i = 0; i < 15; i++)
    {
        core.r[3] = i;
        std::cout << "in: " << std::dec << core.r[3] << std::endl;
        
        core.CIA = 0;
        core.lr = 0xFFFFFFFC;
        core.execute();

        std::cout << "out: " << std::dec << core.r[3] << std::endl;
    }

    return 0;
}